

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwindowsysteminterface.cpp
# Opt level: O1

void QWindowSystemInterface::handleGeometryChange<QWindowSystemInterface::AsynchronousDelivery>
               (QWindow *window,QRect *newRect)

{
  QPlatformWindow *pQVar1;
  undefined8 in_RCX;
  QRect QVar2;
  QRect args_1;
  
  QVar2 = QHighDpi::fromNativeWindowGeometry<QRect,QWindow>(newRect,window);
  args_1._0_8_ = QVar2._8_8_;
  pQVar1 = QWindow::handle(window);
  if (pQVar1 != (QPlatformWindow *)0x0) {
    pQVar1 = QWindow::handle(window);
    QPlatformWindow::setGeometry(pQVar1,newRect);
  }
  args_1.x2.m_i = (int)in_RCX;
  args_1.y2.m_i = (int)((ulong)in_RCX >> 0x20);
  QWindowSystemHelper<QWindowSystemInterface::AsynchronousDelivery>::
  handleEvent<QWindowSystemInterfacePrivate::GeometryChangeEvent,QWindow*,QRect>
            ((QWindowSystemHelper<QWindowSystemInterface::AsynchronousDelivery> *)window,QVar2._0_8_
             ,args_1);
  return;
}

Assistant:

QT_DEFINE_QPA_EVENT_HANDLER(void, handleGeometryChange, QWindow *window, const QRect &newRect)
{
    Q_ASSERT(window);
    const auto newRectDi = QHighDpi::fromNativeWindowGeometry(newRect, window);
    if (window->handle()) {
        // Persist the new geometry so that QWindow::geometry() can be queried in the resize event
        window->handle()->QPlatformWindow::setGeometry(newRect);
        // FIXME: This does not work during platform window creation, where the QWindow does not
        // have its handle set up yet. Platforms that deliver events during window creation need
        // to handle the persistence manually, e.g. by overriding geometry().
    }
    handleWindowSystemEvent<QWindowSystemInterfacePrivate::GeometryChangeEvent, Delivery>(window, newRectDi);
}